

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-custom.cc
# Opt level: O0

bool __thiscall DataSourceCustom::load_animation_table(DataSourceCustom *this)

{
  ulong uVar1;
  _Setfill<char> _Var2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  int local_578;
  allocator<char> local_571;
  string local_570;
  string local_550;
  int local_530;
  allocator<char> local_529;
  string local_528;
  string local_508;
  int local_4e8;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  undefined1 local_49c [8];
  Animation animation;
  stringstream local_488 [8];
  stringstream stream_1;
  undefined1 local_478 [376];
  ulong local_300;
  size_t j;
  vector<Data::Animation,_std::allocator<Data::Animation>_> animations;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  ulong local_290;
  size_t count;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  ConfigFile meta;
  stringstream local_1b0 [8];
  stringstream stream;
  undefined1 local_1a0 [376];
  ulong local_28;
  size_t i;
  ResInfo *info;
  DataSourceCustom *this_local;
  
  info = (ResInfo *)this;
  i = (size_t)get_info(this,AssetAnimation);
  if ((ResInfo *)i == (ResInfo *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    for (local_28 = 0; uVar1 = local_28, uVar4 = Data::get_resource_count(AssetAnimation),
        uVar1 < uVar4; local_28 = local_28 + 1) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      _Var2 = std::setfill<char>('0');
      poVar6 = std::operator<<(local_1a0,_Var2._M_c);
      meta.data._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = std::setw(3);
      poVar6 = std::operator<<(poVar6,meta.data._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                      _0_4_);
      std::ostream::operator<<(poVar6,local_28);
      ConfigFile::ConfigFile((ConfigFile *)local_200);
      std::operator+(&local_260,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(i + 0x10)
                     ,"/");
      std::__cxx11::stringstream::str();
      std::operator+(&local_240,&local_260,&local_280);
      std::operator+(&local_220,&local_240,".ini");
      bVar3 = ConfigFile::load((ConfigFile *)local_200,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_260);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b0,"general",&local_2b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d8,"count",
                   (allocator<char> *)
                   ((long)&animations.
                           super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        animations.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        iVar5 = ConfigFile::value<int>
                          ((ConfigFile *)local_200,&local_2b0,&local_2d8,
                           (int *)&animations.
                                   super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&animations.
                           super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::~string((string *)&local_2b0);
        std::allocator<char>::~allocator(&local_2b1);
        local_290 = (long)iVar5;
        std::vector<Data::Animation,_std::allocator<Data::Animation>_>::vector
                  ((vector<Data::Animation,_std::allocator<Data::Animation>_> *)&j);
        for (local_300 = 0; local_300 < local_290; local_300 = local_300 + 1) {
          std::__cxx11::stringstream::stringstream(local_488);
          animation.y._3_1_ = std::setfill<char>('0');
          poVar6 = std::operator<<(local_478,animation.y._3_1_);
          animation.x = (int)std::setw(3);
          poVar6 = std::operator<<(poVar6,(_Setw)animation.x);
          std::ostream::operator<<(poVar6,local_300);
          std::__cxx11::stringstream::str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4e0,"sprite",&local_4e1);
          local_4e8 = 0;
          iVar5 = ConfigFile::value<int>((ConfigFile *)local_200,&local_4c0,&local_4e0,&local_4e8);
          local_49c[0] = (uint8_t)iVar5;
          std::__cxx11::string::~string((string *)&local_4e0);
          std::allocator<char>::~allocator(&local_4e1);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::__cxx11::stringstream::str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"x",&local_529);
          local_530 = 0;
          local_49c._4_4_ =
               ConfigFile::value<int>((ConfigFile *)local_200,&local_508,&local_528,&local_530);
          std::__cxx11::string::~string((string *)&local_528);
          std::allocator<char>::~allocator(&local_529);
          std::__cxx11::string::~string((string *)&local_508);
          std::__cxx11::stringstream::str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"y",&local_571);
          local_578 = 0;
          animation._0_4_ =
               ConfigFile::value<int>((ConfigFile *)local_200,&local_550,&local_570,&local_578);
          std::__cxx11::string::~string((string *)&local_570);
          std::allocator<char>::~allocator(&local_571);
          std::__cxx11::string::~string((string *)&local_550);
          std::vector<Data::Animation,_std::allocator<Data::Animation>_>::push_back
                    ((vector<Data::Animation,_std::allocator<Data::Animation>_> *)&j,
                     (value_type *)local_49c);
          std::__cxx11::stringstream::~stringstream(local_488);
        }
        std::
        vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
        ::push_back(&(this->super_DataSourceBase).animation_table,(value_type *)&j);
        std::vector<Data::Animation,_std::allocator<Data::Animation>_>::~vector
                  ((vector<Data::Animation,_std::allocator<Data::Animation>_> *)&j);
        count._4_4_ = 0;
      }
      else {
        this_local._7_1_ = 0;
        count._4_4_ = 1;
      }
      ConfigFile::~ConfigFile((ConfigFile *)local_200);
      std::__cxx11::stringstream::~stringstream(local_1b0);
      if (count._4_4_ != 0) goto LAB_0015b258;
    }
    this_local._7_1_ = 1;
  }
LAB_0015b258:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
DataSourceCustom::load_animation_table() {
  ResInfo *info = get_info(Data::AssetAnimation);
  if (info == nullptr) {
    return false;
  }

  for (size_t i = 0; i < Data::get_resource_count(Data::AssetAnimation); i++) {
    std::stringstream stream;
    stream << std::setfill('0') << std::setw(3) << i;
    ConfigFile meta = ConfigFile();
    if (!meta.load(info->path + "/" + stream.str() + ".ini")) {
      return false;
    }
    size_t count = meta.value("general", "count", 0);
    std::vector<Data::Animation> animations;
    for (size_t j = 0; j < count; j++) {
      std::stringstream stream;
      stream << std::setfill('0') << std::setw(3) << j;
      Data::Animation animation;
      animation.sprite = meta.value(stream.str(), "sprite", 0);
      animation.x = meta.value(stream.str(), "x", 0);
      animation.y = meta.value(stream.str(), "y", 0);
      animations.push_back(animation);
    }
    animation_table.push_back(animations);
  }

  return true;
}